

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool absl::lts_20250127::base_internal::ReadLongFromFile(char *file,long *value)

{
  ssize_t sVar1;
  int *piVar2;
  long lVar3;
  bool bVar4;
  long temp_value;
  ssize_t len;
  char *err;
  char line [1024];
  int fd;
  int file_mode;
  bool ret;
  long *value_local;
  char *file_local;
  
  fd._3_1_ = false;
  line._1020_4_ = open(file,0x80000);
  if (line._1020_4_ != -1) {
    memset(&err,0,0x400);
    do {
      sVar1 = read(line._1020_4_,&err,0x3ff);
      bVar4 = false;
      if (sVar1 < 0) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    if (sVar1 < 1) {
      fd._3_1_ = false;
    }
    else {
      lVar3 = strtol((char *)&err,(char **)&len,10);
      if (((char)err != '\0') && ((*(char *)len == '\n' || (*(char *)len == '\0')))) {
        *value = lVar3;
        fd._3_1_ = true;
      }
    }
    close(line._1020_4_);
  }
  return fd._3_1_;
}

Assistant:

static bool ReadLongFromFile(const char *file, long *value) {
  bool ret = false;
#if defined(_POSIX_C_SOURCE)
  const int file_mode = (O_RDONLY | O_CLOEXEC);
#else
  const int file_mode = O_RDONLY;
#endif

  int fd = open(file, file_mode);
  if (fd != -1) {
    char line[1024];
    char *err;
    memset(line, '\0', sizeof(line));
    ssize_t len;
    do {
      len = read(fd, line, sizeof(line) - 1);
    } while (len < 0 && errno == EINTR);
    if (len <= 0) {
      ret = false;
    } else {
      const long temp_value = strtol(line, &err, 10);
      if (line[0] != '\0' && (*err == '\n' || *err == '\0')) {
        *value = temp_value;
        ret = true;
      }
    }
    close(fd);
  }
  return ret;
}